

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O0

void __thiscall dtc::fdt::property_value::push_to_buffer(property_value *this,byte_buffer *buffer)

{
  vector<unsigned_char,std::allocator<unsigned_char>> *this_00;
  bool bVar1;
  value_type_conflict1 local_41 [9];
  uchar *local_38;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_30;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_28;
  const_iterator local_20;
  vector<unsigned_char,std::allocator<unsigned_char>> *local_18;
  byte_buffer *buffer_local;
  property_value *this_local;
  
  local_18 = (vector<unsigned_char,std::allocator<unsigned_char>> *)buffer;
  buffer_local = (byte_buffer *)this;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->byte_data);
  this_00 = local_18;
  if (bVar1) {
    push_string((byte_buffer *)local_18,&this->string_data,true);
    local_41[0] = '\0';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_18,local_41);
  }
  else {
    local_28._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_18);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_20,&local_28);
    local_30._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            (&this->byte_data);
    local_38 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                  (&this->byte_data);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              (this_00,local_20,local_30,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )local_38);
  }
  return;
}

Assistant:

void
property_value::push_to_buffer(byte_buffer &buffer)
{
	if (!byte_data.empty())
	{
		buffer.insert(buffer.end(), byte_data.begin(), byte_data.end());
	}
	else
	{
		push_string(buffer, string_data, true);
		// Trailing nul
		buffer.push_back(0);
	}
}